

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

void __thiscall
pbrt::
InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
~InlinedVector(InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
               *this)

{
  this->nStored = 0;
  pstd::pmr::polymorphic_allocator<pbrt::Point3<float>>::deallocate_object<pbrt::Point3<float>>
            ((polymorphic_allocator<pbrt::Point3<float>> *)this,this->ptr,this->nAlloc);
  return;
}

Assistant:

~InlinedVector() {
        clear();
        alloc.deallocate_object(ptr, nAlloc);
    }